

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O1

void __thiscall
AnalyserExternalVariable_removeDependencyByPointer_Test::
~AnalyserExternalVariable_removeDependencyByPointer_Test
          (AnalyserExternalVariable_removeDependencyByPointer_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AnalyserExternalVariable, removeDependencyByPointer)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));
    auto dummy = model->component("membrane")->variable("Cm");

    EXPECT_FALSE(externalVariable->removeDependency(dummy));

    externalVariable->addDependency(dummy);

    EXPECT_TRUE(externalVariable->removeDependency(dummy));
    EXPECT_FALSE(externalVariable->removeDependency(nullptr));
}